

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::argList(Parse *this)

{
  int iVar1;
  DelimiterTable *pDVar2;
  pointer pbVar3;
  int iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  pointer pbVar7;
  allocator local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  
  iVar4 = expression(this);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->paramCall
               ,&this->expName);
    if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
        super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::__cxx11::string::string((string *)&val,",",&local_59);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&val);
      iVar4 = *pmVar5;
      iVar1 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].id;
      std::__cxx11::string::~string((string *)&val);
      if (iVar4 == iVar1) {
        this->curIndex = this->curIndex + 1;
        iVar4 = argList(this);
        if (iVar4 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_28255);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,(this->tokenVec->
                                     super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                     super__Vector_impl_data._M_start[this->curIndex].line);
          poVar6 = std::operator<<(poVar6,anon_var_dwarf_27d3a);
          std::endl<char,std::char_traits<char>>(poVar6);
          exit(0);
        }
      }
    }
    pbVar3 = (this->paramCall).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __range2 = &this->paramCall;
    for (pbVar7 = (this->paramCall).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1)
    {
      std::__cxx11::string::string((string *)&val,(string *)pbVar7);
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[8],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                 (char (*) [8])"paramin",&val,(char (*) [3])"__",(char (*) [3])"__");
      std::__cxx11::string::~string((string *)&val);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(__range2);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Parse::argList() {
    if(expression())  {
        paramCall.emplace_back(expName);
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
            curIndex++;
            if (!argList()) {
                cout << ",后没有参数定义在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
        }
        for(auto val : paramCall) {
            quadVec.emplace_back("paramin", val, "__", "__");
        }
        paramCall.clear();
        return 1;
    }
    return 0;
}